

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * FixText(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  undefined1 local_60 [8];
  wstring input;
  
  NJamSpell::UTF8ToWide((wstring *)local_60,text);
  NJamSpell::TSpellCorrector::FixFragment
            ((wstring *)((long)&input.field_2 + 8),corrector,(wstring *)local_60);
  NJamSpell::WideToUTF8(__return_storage_ptr__,(wstring *)((long)&input.field_2 + 8));
  if ((undefined1 *)input.field_2._8_8_ != &stack0xffffffffffffffd0) {
    operator_delete((void *)input.field_2._8_8_);
  }
  if (local_60 != (undefined1  [8])&input._M_string_length) {
    operator_delete((void *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixText(const NJamSpell::TSpellCorrector& corrector,
                    const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    return NJamSpell::WideToUTF8(corrector.FixFragment(input));
}